

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O3

void __thiscall cursespp::ListOverlay::CustomListWindow::Reset(CustomListWindow *this)

{
  function<void_()> *__x;
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  local_18 = (code *)0x0;
  uStack_10 = 0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  __x = std::function<void_()>::operator=(&this->adapterChanged,(function<void_()> *)&local_28);
  std::function<void_()>::operator=(&this->decorator,__x);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Reset() {
            decorator = adapterChanged = Callback();
        }